

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateVisitCode
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "$name$_ = visitor.visitInt(has$capitalized_name$(), $name$_,\n    other.has$capitalized_name$(), other.$name$_);\n"
  ;
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    text = 
    "$name$_ = visitor.visitInt($name$_ != $default_number$, $name$_,    other.$name$_ != $default_number$, other.$name$_);\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateVisitCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitInt(has$capitalized_name$(), $name$_,\n"
      "    other.has$capitalized_name$(), other.$name$_);\n");
  } else if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "$name$_ = visitor.visitInt($name$_ != $default_number$, $name$_,"
      "    other.$name$_ != $default_number$, other.$name$_);\n");
  } else {
    GOOGLE_LOG(FATAL) << "Can't reach here.";
  }
}